

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

size_t __thiscall helics::apps::Connector::addTag(Connector *this,string_view tagName)

{
  size_t sVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  size_t hash;
  string_view *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  
  sVar1 = CLI::std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                    ((hash<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
  std::
  unordered_map<unsigned_long,std::__cxx11::string,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
  ::emplace<unsigned_long_const&,std::basic_string_view<char,std::char_traits<char>>&>
            ((unordered_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
             &in_stack_ffffffffffffffc8->_M_len,in_RDI);
  return sVar1;
}

Assistant:

std::size_t Connector::addTag(std::string_view tagName)
{
    const std::size_t hash = std::hash<std::string_view>()(tagName);
    tags.emplace(hash, tagName);
    return hash;
}